

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *file;
  Type type;
  int extraout_EAX;
  Exception *this_00;
  int in_ECX;
  int in_EDX;
  char *in_R8;
  char *in_R9;
  undefined1 in_stack_00000008 [16];
  String local_58;
  char *local_30;
  char *macroArgs_local;
  char *condition_local;
  int osErrorNumber_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  local_30 = in_R9;
  macroArgs_local = in_R8;
  condition_local._0_4_ = in_ECX;
  condition_local._4_4_ = in_EDX;
  _osErrorNumber_local = ctx;
  file_local = (char *)this;
  this_00 = (Exception *)operator_new(400);
  type = anon_unknown_2::typeOfErrno((int)condition_local);
  file = _osErrorNumber_local;
  anon_unknown_2::makeDescriptionImpl
            (&local_58,SYSCALL,macroArgs_local,(int)condition_local,(char *)0x0,local_30,
             (ArrayPtr<kj::String>)in_stack_00000008);
  Exception::Exception(this_00,type,(char *)file,condition_local._4_4_,&local_58);
  this->exception = this_00;
  String::~String(&local_58);
  return extraout_EAX;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, int osErrorNumber,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(typeOfErrno(osErrorNumber), file, line,
      makeDescriptionImpl(SYSCALL, condition, osErrorNumber, nullptr, macroArgs, argValues));
}